

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int CVodeSetPreconditioner(void *cvode_mem,CVLsPrecSetupFn psetup,CVLsPrecSolveFn psolve)

{
  int iVar1;
  int line;
  char *msgfmt;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetPreconditioner",&cv_mem,&cvls_mem);
  if (iVar1 == 0) {
    cvls_mem->pset = psetup;
    cvls_mem->psolve = psolve;
    if (cvls_mem->LS->ops->setpreconditioner ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      iVar1 = -3;
      line = 0x1d6;
    }
    else {
      if (psetup != (CVLsPrecSetupFn)0x0) {
        psetup = cvLsPSetup;
      }
      if (psolve != (CVLsPrecSolveFn)0x0) {
        psolve = cvLsPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner(cvls_mem->LS,cv_mem,psetup,psolve);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      iVar1 = -9;
      line = 0x1e3;
    }
    cvProcessError(cv_mem,iVar1,line,"CVodeSetPreconditioner",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                   ,msgfmt);
  }
  return iVar1;
}

Assistant:

int CVodeSetPreconditioner(void* cvode_mem, CVLsPrecSetupFn psetup,
                           CVLsPrecSolveFn psolve)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  SUNPSetupFn cvls_psetup;
  SUNPSolveFn cvls_psolve;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* store function pointers for user-supplied routines in CVLs interface */
  cvls_mem->pset   = psetup;
  cvls_mem->psolve = psolve;

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (cvls_mem->LS->ops->setpreconditioner == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "SUNLinearSolver object does not support user-supplied "
                   "preconditioning");
    return (CVLS_ILL_INPUT);
  }

  /* notify iterative linear solver to call CVLs interface routines */
  cvls_psetup = (psetup == NULL) ? NULL : cvLsPSetup;
  cvls_psolve = (psolve == NULL) ? NULL : cvLsPSolve;
  retval      = SUNLinSolSetPreconditioner(cvls_mem->LS, cv_mem, cvls_psetup,
                                           cvls_psolve);
  if (retval != SUN_SUCCESS)
  {
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                   "Error in calling SUNLinSolSetPreconditioner");
    return (CVLS_SUNLS_FAIL);
  }

  return (CVLS_SUCCESS);
}